

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O2

void FWHT(fwht_t *data,uint bits)

{
  uint width;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint j;
  ulong uVar5;
  int iVar6;
  
  for (uVar1 = 1; uVar1 < 0x10000; uVar1 = uVar1 * 2) {
    uVar2 = (ulong)uVar1;
    for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + uVar2 * 2) {
      for (uVar5 = uVar4; uVar5 < uVar4 + uVar2; uVar5 = uVar5 + 1) {
        iVar3 = (uint)data[uVar2 + uVar5] + (uint)data[uVar5];
        iVar6 = (uint)data[uVar5] - (uint)data[uVar2 + uVar5];
        data[uVar5] = (short)((uint)iVar3 >> 0x10) + (short)iVar3;
        data[uVar2 + uVar5] = (short)((uint)iVar6 >> 0x10) + (short)iVar6;
      }
    }
  }
  return;
}

Assistant:

static void FWHT(fwht_t* data, const unsigned bits)
{
    const unsigned size = (unsigned)(1UL << bits);
    for (unsigned width = 1; width < size; width <<= 1)
        for (unsigned i = 0; i < size; i += (width << 1))
            for (unsigned j = i; j < (width + i); ++j)
                FWHT_2(data[j], data[j + width]);
}